

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_test.cpp
# Opt level: O2

void __thiscall HenyeyGreenstein_g_Test::TestBody(HenyeyGreenstein_g_Test *this)

{
  char *message;
  float fVar1;
  float fVar2;
  undefined8 uVar8;
  undefined1 extraout_var_00 [56];
  undefined1 auVar4 [64];
  undefined8 uVar3;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar11 [16];
  Vector3f VVar12;
  Vector3f wi;
  Vector3f wo;
  float local_f0;
  HGPhaseFunction hg;
  undefined8 local_e8;
  AssertionResult gtest_ar;
  Point2f u;
  Stratified2DIter __begin2;
  Stratified2DIter __end2;
  RNG rng;
  undefined1 extraout_var [60];
  undefined1 auVar9 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar10 [56];
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  for (fVar1 = -0.75; fVar1 <= 0.75; fVar1 = fVar1 + 0.25) {
    hg.g = fVar1;
    fVar2 = pbrt::RNG::Uniform<float>(&rng);
    local_e8._0_4_ = fVar2;
    gtest_ar._4_4_ = pbrt::RNG::Uniform<float>(&rng);
    auVar9 = extraout_var_00;
    gtest_ar._0_4_ = fVar2;
    VVar12 = pbrt::SampleUniformSphere((Point2f *)&gtest_ar);
    fVar2 = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar9;
    gtest_ar.success_ = false;
    gtest_ar._1_3_ = 0x10;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pbrt::detail::IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter>::begin
              (&__begin2,
               (IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter> *)&gtest_ar);
    pbrt::detail::IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter>::end
              (&__end2,(IndexingGenerator<pbrt::Stratified2D,_pbrt::detail::Stratified2DIter> *)
                       &gtest_ar);
    uVar3 = 0;
    uVar8 = 0;
    while (__begin2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
           super_IndexingIterator<pbrt::detail::Stratified2DIter>.i !=
           __end2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
           super_IndexingIterator<pbrt::detail::Stratified2DIter>.i) {
      stack0xffffffffffffff20 = (double)uVar8;
      local_e8 = uVar3;
      auVar5._0_8_ = pbrt::detail::Stratified2DIter::operator*(&__begin2);
      auVar5._8_56_ = extraout_var_01;
      u.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar5._0_16_);
      auVar10 = extraout_var_01;
      wi = pbrt::SampleUniformSphere(&u);
      local_f0 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar6._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar10;
      wo.super_Tuple3<pbrt::Vector3,_float>.z = fVar2;
      wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar4._0_8_;
      wo.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)auVar4._0_8_ >> 0x20);
      auVar7._0_4_ = pbrt::HGPhaseFunction::p(&hg,wo,wi);
      auVar7._4_60_ = extraout_var;
      __begin2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
      super_IndexingIterator<pbrt::detail::Stratified2DIter>.i =
           __begin2.super_RNGIterator<pbrt::detail::Stratified2DIter>.
           super_IndexingIterator<pbrt::detail::Stratified2DIter>.i + 1;
      auVar11._0_4_ =
           VVar12.super_Tuple3<pbrt::Vector3,_float>.x * wi.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar11._4_4_ =
           VVar12.super_Tuple3<pbrt::Vector3,_float>.y * wi.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar11._8_4_ = auVar9._0_4_ * auVar10._0_4_;
      auVar11._12_4_ = auVar9._4_4_ * auVar10._4_4_;
      auVar11 = vmovshdup_avx(auVar11);
      auVar11 = vfmadd231ss_fma(auVar11,auVar4._0_16_,auVar6._0_16_);
      auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)local_f0),ZEXT416((uint)fVar2));
      _local_e8 = vfnmadd231ss_fma(_local_e8,auVar7._0_16_,auVar11);
      uVar3 = local_e8;
      uVar8 = stack0xffffffffffffff20;
    }
    testing::internal::DoubleNearPredFormat
              ((char *)CONCAT44(hg.g,local_f0),(char *)CONCAT44(fVar1,fVar2),(char *)0x2ed347,
               (double)gtest_ar.message_.ptr_,(double)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_),
               stack0xffffffffffffff20);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&__begin2);
      message = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&__end2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media_test.cpp"
                 ,0x60,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&__end2,(Message *)&__begin2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__end2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&__begin2);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(HenyeyGreenstein, g) {
    RNG rng;
    for (float g = -.75; g <= 0.75; g += 0.25) {
        HGPhaseFunction hg(g);
        Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Float sum = 0;
        int sqrtSamples = 64;
        int nSamples = sqrtSamples * sqrtSamples;
        for (Point2f u : Stratified2D(sqrtSamples, sqrtSamples)) {
            Vector3f wi = SampleUniformSphere(u);
            // Negate dot to match direction convention
            sum += hg.p(wo, wi) * -Dot(wo, wi);
        }
        Float gEst = sum / (nSamples * UniformSpherePDF());
        EXPECT_NEAR(g, gEst, .01);
    }
}